

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgramChain.cpp
# Opt level: O0

void __thiscall
BamTools::SamProgramChain::Add
          (SamProgramChain *this,
          vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_> *programs)

{
  bool bVar1;
  iterator __lhs;
  vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_> *in_RDI;
  iterator pgEnd;
  iterator pgIter;
  __normal_iterator<BamTools::SamProgram_*,_std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (SamProgram *)
       std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>::begin(in_RDI);
  __lhs = std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<BamTools::SamProgram_*,_std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<BamTools::SamProgram_*,_std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<BamTools::SamProgram_*,_std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>_>
    ::operator*(local_18);
    Add(this,(SamProgram *)programs);
    __gnu_cxx::
    __normal_iterator<BamTools::SamProgram_*,_std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>_>
    ::operator++(local_18);
  }
  return;
}

Assistant:

void SamProgramChain::Add(std::vector<SamProgram>& programs)
{
    std::vector<SamProgram>::iterator pgIter = programs.begin();
    std::vector<SamProgram>::iterator pgEnd = programs.end();
    for (; pgIter != pgEnd; ++pgIter) {
        Add(*pgIter);
    }
}